

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_param(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *cclass;
  char *cclass_00;
  char *cclass_01;
  int iVar7;
  int yythunkpos0;
  int yypos0;
  
  iVar6 = G->pos;
  iVar1 = G->thunkpos;
  yyDo(G,yyPush,6,0,"yyPush");
  yyDo(G,yy_1_param,G->begin,G->end,"yy_1_param");
  iVar4 = G->pos;
  iVar7 = G->thunkpos;
  iVar3 = yy_ident(G);
  if (iVar3 != 0) {
    yyDo(G,yySet,-6,0,"yySet");
    while (iVar3 = yy_ws(G), iVar3 != 0) {
      iVar4 = G->pos;
      iVar7 = G->thunkpos;
    }
  }
  G->pos = iVar4;
  G->thunkpos = iVar7;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar4 = G->pos;
  iVar7 = G->thunkpos;
  iVar3 = yymatchChar(G,0x2a);
  if ((iVar3 == 0) || (iVar3 = yy_array_var(G), iVar3 == 0)) {
    G->pos = iVar4;
    G->thunkpos = iVar7;
    iVar4 = yy_term(G);
    if (iVar4 == 0) {
      G->pos = iVar6;
      G->thunkpos = iVar1;
      return 0;
    }
  }
  else {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_1_param_term,G->begin,G->end,"yy_1_param_term");
  }
  yyDo(G,yyPop,1,0,"yyPop");
  iVar6 = -5;
LAB_0010762d:
  while( true ) {
    yyDo(G,yySet,iVar6,0,"yySet");
    iVar6 = G->pos;
    iVar1 = G->thunkpos;
    yy__(G);
    iVar4 = G->pos;
    iVar7 = G->thunkpos;
    yyDo(G,yyPush,1,0,"yyPush");
    iVar3 = yymatchChar(G,0x3d);
    if (iVar3 == 0) break;
    yy__(G);
    iVar3 = yy_expr(G);
    if (iVar3 == 0) break;
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_1_param_defaults,G->begin,G->end,"yy_1_param_defaults");
    yyDo(G,yyPop,1,0,"yyPop");
    iVar6 = -4;
  }
  G->pos = iVar4;
  G->thunkpos = iVar7;
  iVar4 = yymatchString(G,"is");
  if ((iVar4 == 0) || (iVar4 = yy_ws(G), iVar4 == 0)) {
LAB_00107858:
    G->pos = iVar6;
    G->thunkpos = iVar1;
    yyDo(G,yy_2_param,G->begin,G->end,"yy_2_param");
    yyDo(G,yyPop,6,0,"yyPop");
    return 1;
  }
  do {
    iVar4 = G->pos;
    iVar7 = G->thunkpos;
    iVar3 = yy_ws(G);
  } while (iVar3 != 0);
  G->pos = iVar4;
  G->thunkpos = iVar7;
  iVar3 = yymatchString(G,"copy");
  if (iVar3 != 0) {
    iVar3 = G->pos;
    iVar2 = G->thunkpos;
    iVar5 = yymatchClass(G,(uchar *)"",cclass);
    if (iVar5 == 0) {
      G->pos = iVar3;
      G->thunkpos = iVar2;
      yyDo(G,yy_1_is_copy,G->begin,G->end,"yy_1_is_copy");
      iVar6 = -3;
      goto LAB_0010762d;
    }
  }
  G->pos = iVar4;
  G->thunkpos = iVar7;
  iVar3 = yymatchString(G,"rw");
  if (iVar3 != 0) {
    iVar3 = G->pos;
    iVar2 = G->thunkpos;
    iVar5 = yymatchClass(G,(uchar *)"",cclass_00);
    if (iVar5 == 0) {
      G->pos = iVar3;
      G->thunkpos = iVar2;
      yyDo(G,yy_1_is_rw,G->begin,G->end,"yy_1_is_rw");
      iVar6 = -2;
      goto LAB_0010762d;
    }
  }
  G->pos = iVar4;
  G->thunkpos = iVar7;
  iVar4 = yymatchString(G,"ref");
  if (iVar4 == 0) goto LAB_00107858;
  iVar4 = G->pos;
  iVar7 = G->thunkpos;
  iVar3 = yymatchClass(G,(uchar *)"",cclass_01);
  if (iVar3 != 0) goto LAB_00107858;
  G->pos = iVar4;
  G->thunkpos = iVar7;
  yyDo(G,yy_1_is_ref,G->begin,G->end,"yy_1_is_ref");
  iVar6 = -1;
  goto LAB_0010762d;
}

Assistant:

YY_RULE(int) yy_param(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 6, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "param"));
  yyDo(G, yy_1_param, G->begin, G->end, "yy_1_param");

  {  int yypos237= G->pos, yythunkpos237= G->thunkpos;  if (!yy_ident(G))  goto l237;
  yyDo(G, yySet, -6, 0, "yySet");
  if (!yy_ws(G))  goto l237;

  l239:;	
  {  int yypos240= G->pos, yythunkpos240= G->thunkpos;  if (!yy_ws(G))  goto l240;
  goto l239;
  l240:;	  G->pos= yypos240; G->thunkpos= yythunkpos240;
  }  goto l238;
  l237:;	  G->pos= yypos237; G->thunkpos= yythunkpos237;
  }
  l238:;	  if (!yy_param_term(G))  goto l236;
  yyDo(G, yySet, -5, 0, "yySet");

  l241:;	
  {  int yypos242= G->pos, yythunkpos242= G->thunkpos;  if (!yy__(G))  goto l242;

  {  int yypos243= G->pos, yythunkpos243= G->thunkpos;  if (!yy_param_defaults(G))  goto l244;
  yyDo(G, yySet, -4, 0, "yySet");
  goto l243;
  l244:;	  G->pos= yypos243; G->thunkpos= yythunkpos243;  if (!yymatchString(G, "is")) goto l242;
  if (!yy_ws(G))  goto l242;

  l245:;	
  {  int yypos246= G->pos, yythunkpos246= G->thunkpos;  if (!yy_ws(G))  goto l246;
  goto l245;
  l246:;	  G->pos= yypos246; G->thunkpos= yythunkpos246;
  }
  {  int yypos247= G->pos, yythunkpos247= G->thunkpos;  if (!yy_is_copy(G))  goto l248;
  yyDo(G, yySet, -3, 0, "yySet");
  goto l247;
  l248:;	  G->pos= yypos247; G->thunkpos= yythunkpos247;  if (!yy_is_rw(G))  goto l249;
  yyDo(G, yySet, -2, 0, "yySet");
  goto l247;
  l249:;	  G->pos= yypos247; G->thunkpos= yythunkpos247;  if (!yy_is_ref(G))  goto l242;
  yyDo(G, yySet, -1, 0, "yySet");

  }
  l247:;	
  }
  l243:;	  goto l241;
  l242:;	  G->pos= yypos242; G->thunkpos= yythunkpos242;
  }  yyDo(G, yy_2_param, G->begin, G->end, "yy_2_param");
  yyprintf((stderr, "  ok   param"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 6, 0, "yyPop");
  return 1;
  l236:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "param"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}